

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmVariableDefinitions
                    (ExpressionContext *ctx,VmModule *module,ExprVariableDefinitions *node)

{
  ExprBase *expression;
  VmValue *pVVar1;
  IntrusiveList<ExprBase> *pIVar2;
  
  pIVar2 = &node->definitions;
  while (expression = pIVar2->head, expression != (ExprBase *)0x0) {
    CompileVm(ctx,module,expression);
    pIVar2 = (IntrusiveList<ExprBase> *)&expression->next;
  }
  pVVar1 = anon_unknown.dwarf_11cad6::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmVariableDefinitions(ExpressionContext &ctx, VmModule *module, ExprVariableDefinitions *node)
{
	for(ExprBase *value = node->definitions.head; value; value = value->next)
		CompileVm(ctx, module, value);

	return CheckType(ctx, node, CreateVoid(module));
}